

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O0

void __thiscall
sptk::GaussianMixtureModeling::FloorVariance
          (GaussianMixtureModeling *this,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          )

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *in_RSI;
  long in_RDI;
  int l;
  int k;
  _func_int **in_stack_ffffffffffffff68;
  Row *in_stack_ffffffffffffff70;
  SymmetricMatrix *in_stack_ffffffffffffff78;
  Row local_58;
  Row local_30;
  int local_18;
  int local_14;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_10;
  
  local_10 = in_RSI;
  for (local_14 = 0; local_14 < *(int *)(in_RDI + 0xc); local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 <= *(int *)(in_RDI + 8); local_18 = local_18 + 1) {
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                (local_10,(long)local_14);
      SymmetricMatrix::operator[]
                (in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      pdVar3 = SymmetricMatrix::Row::operator[]
                         (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20))
      ;
      dVar1 = *pdVar3;
      dVar2 = *(double *)(in_RDI + 0x48);
      SymmetricMatrix::Row::~Row(&local_30);
      if (dVar1 < dVar2) {
        in_stack_ffffffffffffff68 = *(_func_int ***)(in_RDI + 0x48);
        std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator[]
                  (local_10,(long)local_14);
        in_stack_ffffffffffffff70 = &local_58;
        SymmetricMatrix::operator[]
                  (in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
        in_stack_ffffffffffffff78 =
             (SymmetricMatrix *)
             SymmetricMatrix::Row::operator[]
                       (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
        in_stack_ffffffffffffff78->_vptr_SymmetricMatrix = in_stack_ffffffffffffff68;
        SymmetricMatrix::Row::~Row(&local_58);
      }
    }
  }
  return;
}

Assistant:

void GaussianMixtureModeling::FloorVariance(
    std::vector<SymmetricMatrix>* covariance_matrices) const {
  for (int k(0); k < num_mixture_; ++k) {
    for (int l(0); l <= num_order_; ++l) {
      if ((*covariance_matrices)[k][l][l] < variance_floor_) {
        (*covariance_matrices)[k][l][l] = variance_floor_;
      }
    }
  }
}